

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O0

void __thiscall QGroupBox::mouseReleaseEvent(QGroupBox *this,QMouseEvent *event)

{
  MouseButton MVar1;
  int iVar2;
  QGroupBoxPrivate *pQVar3;
  QStyleOptionGroupBox *this_00;
  QStyle *pQVar4;
  QSinglePointEvent *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  bool toggle;
  SubControl released;
  QGroupBoxPrivate *d;
  QStyleOptionGroupBox box;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 uVar6;
  QPoint local_98;
  undefined1 local_90 [136];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MVar1 = QSinglePointEvent::button(in_RSI);
  if (MVar1 == LeftButton) {
    pQVar3 = d_func((QGroupBox *)0x5a5758);
    if ((pQVar3->overCheckBox & 1U) == 0) {
      QEvent::ignore((QEvent *)in_RSI);
    }
    else {
      memset(local_90,0xaa,0x88);
      QStyleOptionGroupBox::QStyleOptionGroupBox((QStyleOptionGroupBox *)0x5a5798);
      (**(code **)((long)in_RDI->xp + 0x1a0))(in_RDI,local_90);
      this_00 = (QStyleOptionGroupBox *)
                QWidget::style((QWidget *)
                               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      QSinglePointEvent::position((QSinglePointEvent *)0x5a57c4);
      local_98 = QPointF::toPoint(in_RDI);
      iVar2 = (**(code **)(*(long *)&(this_00->super_QStyleOptionComplex).super_QStyleOption + 0xd0)
              )(this_00,7,local_90,&local_98,in_RDI);
      bVar5 = (pQVar3->checkable & 1U) != 0;
      if (bVar5) {
        in_stack_ffffffffffffff0f = iVar2 == 2 || iVar2 == 1;
      }
      uVar6 = bVar5 && (iVar2 == 2 || iVar2 == 1);
      pQVar3->pressedControl = SC_None;
      pQVar3->overCheckBox = false;
      if (bVar5 && (iVar2 == 2 || iVar2 == 1)) {
        QGroupBoxPrivate::click((QGroupBoxPrivate *)CONCAT17(uVar6,in_stack_ffffffffffffff18));
      }
      else if ((pQVar3->checkable & 1U) != 0) {
        pQVar4 = QWidget::style((QWidget *)
                                CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
        (**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,7,local_90,1,in_RDI);
        QWidget::update((QWidget *)CONCAT17(uVar6,in_stack_ffffffffffffff18),(QRect *)this_00);
      }
      QStyleOptionGroupBox::~QStyleOptionGroupBox(this_00);
    }
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::mouseReleaseEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }

    Q_D(QGroupBox);
    if (!d->overCheckBox) {
        event->ignore();
        return;
    }
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    QStyle::SubControl released = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                                 event->position().toPoint(), this);
    bool toggle = d->checkable && (released == QStyle::SC_GroupBoxLabel
                                   || released == QStyle::SC_GroupBoxCheckBox);
    d->pressedControl = QStyle::SC_None;
    d->overCheckBox = false;
    if (toggle)
        d->click();
    else if (d->checkable)
        update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));
}